

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

bool wallet::CachedTxIsTrusted(CWallet *wallet,CWalletTx *wtx)

{
  long lVar1;
  bool bVar2;
  char *in_RSI;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff9b;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_ffffffffffffffb8;
  CWalletTx *in_stack_ffffffffffffffc0;
  CWallet *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set(in_stack_ffffffffffffff78);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffb8,in_RDI,
             in_RSI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (bool)in_stack_ffffffffffffff9b);
  bVar2 = CachedTxIsTrusted(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffb8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CachedTxIsTrusted(const CWallet& wallet, const CWalletTx& wtx)
{
    std::set<uint256> trusted_parents;
    LOCK(wallet.cs_wallet);
    return CachedTxIsTrusted(wallet, wtx, trusted_parents);
}